

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_backend.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_posix::posix_localization_backend::install
          (posix_localization_backend *this,locale *base,locale_category_type category,
          character_facet_type type)

{
  message_format<wchar_t> *__f;
  char *pcVar1;
  message_format<char> *__f_00;
  undefined4 in_register_00000014;
  locale *in;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  character_facet_type in_R8D;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  messages_info minf;
  locale_data inf;
  
  in = (locale *)CONCAT44(in_register_00000014,category);
  prepare_data((posix_localization_backend *)base);
  switch(type) {
  case 1:
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b0,
               (__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> *)(base + 0x10));
    create_convert((impl_posix *)this,in,(shared_ptr<__locale_struct_*> *)&local_1b0,in_R8D);
    this_00 = &local_1b0._M_refcount;
    break;
  case 2:
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c0,
               (__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> *)(base + 0x10));
    create_collate((impl_posix *)this,in,(shared_ptr<__locale_struct_*> *)&local_1c0,in_R8D);
    this_00 = &local_1c0._M_refcount;
    break;
  case 4:
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d0,
               (__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> *)(base + 0x10));
    create_formatting((impl_posix *)this,in,(shared_ptr<__locale_struct_*> *)&local_1d0,in_R8D);
    this_00 = &local_1d0._M_refcount;
    break;
  case 8:
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1e0,
               (__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> *)(base + 0x10));
    create_parsing((impl_posix *)this,in,(shared_ptr<__locale_struct_*> *)&local_1e0,in_R8D);
    this_00 = &local_1e0._M_refcount;
    break;
  default:
    if (type == 0x10) {
      gnu_gettext::messages_info::messages_info(&minf);
      util::locale_data::locale_data(&inf);
      util::locale_data::parse(&inf,(string *)(base + 0xb));
      std::__cxx11::string::_M_assign((string *)&minf);
      std::__cxx11::string::_M_assign((string *)&minf.country);
      std::__cxx11::string::_M_assign((string *)&minf.variant);
      std::__cxx11::string::_M_assign((string *)&minf.encoding);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<booster::locale::gnu_gettext::messages_info::domain,std::allocator<booster::locale::gnu_gettext::messages_info::domain>>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 base[4]._M_impl,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 base[5]._M_impl,
                 (back_insert_iterator<std::vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>_>
                  )&minf.domains);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&minf.paths,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(base + 1));
      if (in_R8D == 1) {
        __f_00 = gnu_gettext::create_messages_facet<char>(&minf);
        std::locale::locale<booster::locale::message_format<char>>((locale *)this,in,__f_00);
      }
      else if (in_R8D == 2) {
        __f = gnu_gettext::create_messages_facet<wchar_t>(&minf);
        std::locale::locale<booster::locale::message_format<wchar_t>>((locale *)this,in,__f);
      }
      else {
        std::locale::locale((locale *)this,in);
      }
      util::locale_data::~locale_data(&inf);
      gnu_gettext::messages_info::~messages_info(&minf);
      return (locale)(_Impl *)this;
    }
    if (type == 0x20) {
      pcVar1 = nl_langinfo_l(0xe,*(__locale_t *)base[0x10]._M_impl);
      std::__cxx11::string::string((string *)&minf,pcVar1,(allocator *)&inf);
      create_codecvt((impl_posix *)this,in,&minf.language,in_R8D);
      std::__cxx11::string::~string((string *)&minf);
      return (locale)(_Impl *)this;
    }
    if (type == 0x10000) {
      util::locale_data::locale_data((locale_data *)&minf);
      util::locale_data::parse((locale_data *)&minf,(string *)(base + 0xb));
      util::install_gregorian_calendar((util *)this,in,&minf.country);
      util::locale_data::~locale_data((locale_data *)&minf);
      return (locale)(_Impl *)this;
    }
    if (type == 0x20000) {
      util::create_info((util *)this,in,(string *)(base + 0xb));
      return (locale)(_Impl *)this;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    std::locale::locale((locale *)this,in);
    return (locale)(_Impl *)this;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return (locale)(_Impl *)this;
}

Assistant:

virtual std::locale install(std::locale const &base,
                                    locale_category_type category,
                                    character_facet_type type = nochar_facet)
        {
            prepare_data();

            switch(category) {
            case convert_facet:
                return create_convert(base,lc_,type);
            case collation_facet:
                return create_collate(base,lc_,type);
            case formatting_facet:
                return create_formatting(base,lc_,type);
            case parsing_facet:
                return create_parsing(base,lc_,type);
            case codepage_facet:
                return create_codecvt(base,nl_langinfo_l(CODESET,*lc_),type);
            case calendar_facet:
                {
                    util::locale_data inf;
                    inf.parse(real_id_);
                    return util::install_gregorian_calendar(base,inf.country);
                }
            case message_facet:
                {
                    gnu_gettext::messages_info minf;
                    util::locale_data inf;
                    inf.parse(real_id_);
                    minf.language = inf.language;
                    minf.country = inf.country;
                    minf.variant = inf.variant;
                    minf.encoding = inf.encoding;
                    std::copy(domains_.begin(),domains_.end(),std::back_inserter<gnu_gettext::messages_info::domains_type>(minf.domains));
                    minf.paths = paths_;
                    switch(type) {
                    case char_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char>(minf));
                    case wchar_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<wchar_t>(minf));
                    #ifdef BOOSTER_HAS_CHAR16_T
                    case char16_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char16_t>(minf));
                    #endif
                    #ifdef BOOSTER_HAS_CHAR32_T
                    case char32_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char32_t>(minf));
                    #endif
                    default:
                        return base;
                    }
                }
            case information_facet:
                return util::create_info(base,real_id_);
            default:
                return base;
            }
        }